

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_getCoeff(HModel *this,int row,int col,double *val)

{
  ostream *this_00;
  reference pvVar1;
  uint *puVar2;
  reference pvVar3;
  value_type *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int el;
  int get_el;
  int local_20;
  int local_1c;
  
  printf("Called model.util_getCoeff(row=%d, col=%d)\n",(ulong)in_ESI,(ulong)in_EDX);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,in_RCX);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_1c = -1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)in_EDX);
  local_20 = *pvVar1;
  do {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                        (long)(int)(in_EDX + 1));
    if (*pvVar1 <= local_20) {
LAB_001852f2:
      if (local_1c < 0) {
        *in_RCX = 0.0;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                            (long)local_1c);
        *in_RCX = *pvVar3;
      }
      return;
    }
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_20
                               );
    if (*puVar2 == in_ESI) {
      local_1c = local_20;
      goto LAB_001852f2;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void HModel::util_getCoeff(int row, int col, double* val) {
  assert(row >= 0 && row < numRow);
  assert(col >= 0 && col < numCol);
#ifdef JAJH_dev
  printf("Called model.util_getCoeff(row=%d, col=%d)\n", row, col);cout << flush;
#endif
  //  printf("Called model.util_getCoeff(row=%d, col=%d)\n", row, col);cout << flush;

  cout << val << endl;


  int get_el = -1;
  for (int el=Astart[col]; el < Astart[col+1]; el++) {
    //  printf("Column %4d: Element %4d is row %4d. Is it %4d?\n", col, el, Aindex[el], row);cout << flush;
  if (Aindex[el] == row) {
  get_el = el;
  break;
}
}
  if (get_el < 0) {
    //  printf("model.util_getCoeff: Cannot find row %d in column %d\n", row, col);cout << flush;
  *val = 0;
} else { 
    //  printf("model.util_getCoeff: Found row %d in column %d as element %d: value %g\n", row, col, get_el, Avalue[get_el]);cout << flush;
  *val = Avalue[get_el];
}
}